

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O1

bool booster::regex_search<booster::regex>(string *s,smatch *m,regex *r,int flags)

{
  char *pcVar1;
  size_type sVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  char cVar6;
  pointer local_38;
  pointer ppStack_30;
  pointer local_28;
  
  local_38 = (pointer)0x0;
  ppStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  pcVar1 = (s->_M_dataplus)._M_p;
  cVar6 = booster::regex::search
                    ((char *)r,pcVar1,(vector *)(pcVar1 + s->_M_string_length),(int)&local_38);
  if (cVar6 != '\0') {
    pcVar1 = (s->_M_dataplus)._M_p;
    sVar2 = s->_M_string_length;
    (m->begin_)._M_current = pcVar1;
    (m->end_)._M_current = pcVar1 + sVar2;
    ppVar3 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
    ppVar4 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar5 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = local_38;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppStack_30;
    local_38 = ppVar4;
    ppStack_30 = ppVar5;
    local_28 = ppVar3;
  }
  if (local_38 != (pointer)0x0) {
    operator_delete(local_38);
  }
  return (bool)cVar6;
}

Assistant:

bool regex_search(std::string const &s,smatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		bool res = r.search(s.c_str(),s.c_str()+s.size(),map,flags);
		if(!res) return false;
		m.assign(s.begin(),s.end(),map);
		return true;
	}